

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# injected.h
# Opt level: O3

ptr_type * __thiscall inject::context<0>::injected<consumer>::ptr(injected<consumer> *this)

{
  undefined1 auVar1 [8];
  shared_count sVar2;
  undefined1 local_38 [8];
  shared_count sStack_30;
  element_type *local_28;
  shared_count asStack_20 [2];
  
  if ((this->_ptr).px == (element_type *)0x0) {
    get_current();
    instance<consumer>((context<0> *)local_38);
    sVar2.pi_ = sStack_30.pi_;
    auVar1 = local_38;
    local_38 = (undefined1  [8])0x0;
    sStack_30.pi_ = (sp_counted_base *)0x0;
    local_28 = (this->_ptr).px;
    asStack_20[0].pi_ = (this->_ptr).pn.pi_;
    (this->_ptr).px = (element_type *)auVar1;
    (this->_ptr).pn.pi_ = sVar2.pi_;
    boost::detail::shared_count::~shared_count(asStack_20);
    boost::detail::shared_count::~shared_count(&sStack_30);
  }
  return &this->_ptr;
}

Assistant:

const ptr_type& ptr() const {
      if (_ptr.get() == 0) {
        *const_cast<ptr_type*>(&_ptr) =
          context<ID>::get_current().template instance<T>();
      }
      return _ptr;
    }